

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDupColumn(Index *pIdx,int nKey,Index *pPk,int iCol)

{
  short sVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int j;
  int i;
  int local_28;
  
  sVar1 = *(short *)(*(long *)(in_RDX + 8) + (long)in_ECX * 2);
  local_28 = 0;
  while( true ) {
    if (in_ESI <= local_28) {
      return 0;
    }
    if ((*(short *)(*(long *)(in_RDI + 8) + (long)local_28 * 2) == sVar1) &&
       (iVar2 = sqlite3StrICmp(*(char **)(*(long *)(in_RDI + 0x40) + (long)local_28 * 8),
                               *(char **)(*(long *)(in_RDX + 0x40) + (long)in_ECX * 8)), iVar2 == 0)
       ) break;
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

static int isDupColumn(Index *pIdx, int nKey, Index *pPk, int iCol){
  int i, j;
  assert( nKey<=pIdx->nColumn );
  assert( iCol<MAX(pPk->nColumn,pPk->nKeyCol) );
  assert( pPk->idxType==SQLITE_IDXTYPE_PRIMARYKEY );
  assert( pPk->pTable->tabFlags & TF_WithoutRowid );
  assert( pPk->pTable==pIdx->pTable );
  testcase( pPk==pIdx );
  j = pPk->aiColumn[iCol];
  assert( j!=XN_ROWID && j!=XN_EXPR );
  for(i=0; i<nKey; i++){
    assert( pIdx->aiColumn[i]>=0 || j>=0 );
    if( pIdx->aiColumn[i]==j
     && sqlite3StrICmp(pIdx->azColl[i], pPk->azColl[iCol])==0
    ){
      return 1;
    }
  }
  return 0;
}